

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.cpp
# Opt level: O0

void __thiscall
sc_core::sc_signal<bool,_(sc_core::sc_writer_policy)0>::update
          (sc_signal<bool,_(sc_core::sc_writer_policy)0> *this)

{
  sc_writer_policy_check_write *in_RDI;
  sc_signal<bool,_(sc_core::sc_writer_policy)0> *unaff_retaddr;
  
  sc_writer_policy_check_write::update(in_RDI);
  if ((*(byte *)((long)&in_RDI[0xb].m_writer_p.m_target_p + 1) & 1) !=
      (*(byte *)&in_RDI[0xb].m_writer_p.m_target_p & 1)) {
    do_update(unaff_retaddr);
  }
  return;
}

Assistant:

void
sc_signal<bool,POL>::update()
{
    policy_type::update();
    if( !( base_type::m_new_val == base_type::m_cur_val ) ) {
        do_update();
    }
}